

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O0

size_t __thiscall
cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_prune
          (ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,time_point now)

{
  bool bVar1;
  pointer ptVar2;
  bool local_69;
  const_iterator local_58;
  const_iterator local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  size_t local_38;
  size_t deleted;
  ttl_iterator ttl_iter;
  iterator ttl_end;
  iterator ttl_begin;
  ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this_local;
  time_point now_local;
  
  this_local = (ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *)now.__d.__r;
  ttl_end = std::__cxx11::
            list<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
            ::begin(&this->m_ttl_list);
  ttl_iter._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
       ::end(&this->m_ttl_list);
  std::
  _List_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
  ::_List_iterator((_List_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
                    *)&deleted);
  local_38 = 0;
  deleted = (size_t)ttl_end._M_node;
  while( true ) {
    bVar1 = std::operator!=((_Self *)&deleted,&ttl_iter);
    local_69 = false;
    if (bVar1) {
      ptVar2 = std::
               _List_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
               ::operator->((_List_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
                             *)&deleted);
      local_69 = std::chrono::operator>=
                           ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&this_local,&ptVar2->m_expire_time);
    }
    if (local_69 == false) break;
    ptVar2 = std::
             _List_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
             ::operator->((_List_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
                           *)&deleted);
    local_40 = (ptVar2->m_keyed_elements_position)._M_node;
    local_48 = (_Base_ptr)
               std::
               map<unsigned_long,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element>>>
               ::erase_abi_cxx11_((map<unsigned_long,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,unsigned_long,(cappuccino::thread_safe)1>::keyed_element>>>
                                   *)&this->m_keyed_elements,(iterator)local_40);
    local_38 = local_38 + 1;
    std::
    _List_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
    ::operator++((_List_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
                  *)&deleted);
  }
  bVar1 = std::operator!=((_Self *)&deleted,&ttl_end);
  if (bVar1) {
    std::
    _List_const_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
    ::_List_const_iterator(&local_50,&ttl_end);
    std::
    _List_const_iterator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>
    ::_List_const_iterator(&local_58,(iterator *)&deleted);
    std::__cxx11::
    list<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::ttl_element>_>
    ::erase(&this->m_ttl_list,local_50,local_58);
  }
  return local_38;
}

Assistant:

auto do_prune(std::chrono::steady_clock::time_point now) -> size_t
    {
        const auto   ttl_begin = m_ttl_list.begin();
        const auto   ttl_end   = m_ttl_list.end();
        ttl_iterator ttl_iter;
        size_t       deleted{0};

        // Delete the keyed elements from the map. Not using do_erase to take
        // advantage of iterator range delete for TTLs.
        for (ttl_iter = ttl_begin; ttl_iter != ttl_end && now >= ttl_iter->m_expire_time; ++ttl_iter)
        {
            m_keyed_elements.erase(ttl_iter->m_keyed_elements_position);
            ++deleted;
        }

        // Delete the range of TTLs.
        if (ttl_iter != ttl_begin)
        {
            m_ttl_list.erase(ttl_begin, ttl_iter);
        }

        return deleted;
    }